

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O0

void __thiscall
FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor>::dump_PictureEssenceCoding
          (FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> *this,FILE *stream)

{
  FILE *__stream;
  bool bVar1;
  pointer ppVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  iterator local_b0;
  _Rb_tree_const_iterator<std::pair<const_ASDCP::UL,_const_RateInfo>_> local_a8;
  iterator local_a0;
  _Rb_tree_const_iterator<std::pair<const_ASDCP::UL,_const_RateInfo>_> local_98;
  const_iterator rate_i;
  allocator<char> local_79;
  string local_78 [8];
  string encoding_ul_type;
  char buf [64];
  FILE *stream_local;
  FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> *this_local;
  
  bVar1 = Kumu::Identifier<16U>::HasValue(&(this->m_PictureEssenceCoding).super_Identifier<16U>);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_78,"**UNKNOWN**",&local_79);
    std::allocator<char>::~allocator(&local_79);
    local_a0._M_node =
         (_Base_ptr)
         std::
         map<const_ASDCP::UL,_const_RateInfo,_std::less<const_ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_const_RateInfo>_>_>
         ::find(&g_rate_info,&this->m_PictureEssenceCoding);
    std::_Rb_tree_const_iterator<std::pair<const_ASDCP::UL,_const_RateInfo>_>::
    _Rb_tree_const_iterator(&local_98,&local_a0);
    local_b0._M_node =
         (_Base_ptr)
         std::
         map<const_ASDCP::UL,_const_RateInfo,_std::less<const_ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_const_RateInfo>_>_>
         ::end(&g_rate_info);
    std::_Rb_tree_const_iterator<std::pair<const_ASDCP::UL,_const_RateInfo>_>::
    _Rb_tree_const_iterator(&local_a8,&local_b0);
    bVar1 = std::operator==(&local_98,&local_a8);
    __stream = _stderr;
    if (bVar1) {
      uVar3 = ASDCP::UL::EncodeString
                        ((char *)&this->m_PictureEssenceCoding,(int)&encoding_ul_type + 0x18);
      fprintf(__stream,"Unknown PictureEssenceCoding UL: %s\n",uVar3);
    }
    else {
      ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_ASDCP::UL,_const_RateInfo>_>::operator->
                         (&local_98);
      std::__cxx11::string::operator=(local_78,(string *)&(ppVar2->second).label);
    }
    uVar3 = ASDCP::UL::EncodeString
                      ((char *)&this->m_PictureEssenceCoding,(int)&encoding_ul_type + 0x18);
    uVar4 = std::__cxx11::string::c_str();
    fprintf((FILE *)stream,"PictureEssenceCoding: %s (%s)\n",uVar3,uVar4);
    std::__cxx11::string::~string(local_78);
  }
  return;
}

Assistant:

void dump_PictureEssenceCoding(FILE* stream = 0)
  {
    char buf[64];

    if ( m_PictureEssenceCoding.HasValue() )
      {
	std::string encoding_ul_type = "**UNKNOWN**";

	rate_info_map::const_iterator rate_i = g_rate_info.find(m_PictureEssenceCoding);
	if ( rate_i == g_rate_info.end() )
	  {
	    fprintf(stderr, "Unknown PictureEssenceCoding UL: %s\n", m_PictureEssenceCoding.EncodeString(buf, 64));
	  }
	else
	  {
	    encoding_ul_type = rate_i->second.label;
	  }

	fprintf(stream, "PictureEssenceCoding: %s (%s)\n",
		m_PictureEssenceCoding.EncodeString(buf, 64),
		encoding_ul_type.c_str());
      }
  }